

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O1

void __thiscall
draco::PlyProperty::PlyProperty
          (PlyProperty *this,string *name,DataType data_type,DataType list_type)

{
  pointer pcVar1;
  int32_t iVar2;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->data_type_ = data_type;
  this->list_data_type_ = list_type;
  iVar2 = DataTypeLength(data_type);
  this->data_type_num_bytes_ = iVar2;
  iVar2 = DataTypeLength(list_type);
  this->list_data_type_num_bytes_ = iVar2;
  return;
}

Assistant:

PlyProperty::PlyProperty(const std::string &name, DataType data_type,
                         DataType list_type)
    : name_(name), data_type_(data_type), list_data_type_(list_type) {
  data_type_num_bytes_ = DataTypeLength(data_type);
  list_data_type_num_bytes_ = DataTypeLength(list_type);
}